

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

void __thiscall CStorage::FindDataDir(CStorage *this)

{
  char *src;
  int iVar1;
  char *buffer;
  long lVar2;
  long in_FS_OFFSET;
  char aBaseDir [512];
  char acStack_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = fs_is_dir("data/mapres");
  if (iVar1 == 0) {
    iVar1 = fs_is_dir("data/mapres");
    if (iVar1 == 0) {
      str_copy(acStack_238,this->m_aAppDir,0x200);
      buffer = this->m_aDataDir;
      str_format(buffer,0x200,"%s/data",acStack_238);
      str_append(acStack_238,"/data/mapres",0x200);
      iVar1 = fs_is_dir(acStack_238);
      if (iVar1 == 0) {
        *buffer = '\0';
        for (lVar2 = 0; lVar2 != 0x38; lVar2 = lVar2 + 8) {
          src = *(char **)((long)&PTR_anon_var_dwarf_19f387_00208ce0 + lVar2);
          str_format(acStack_238,0x80,"%s/mapres",src);
          iVar1 = fs_is_dir(acStack_238);
          if (iVar1 != 0) {
            str_copy(buffer,src,0x200);
            goto LAB_001bd532;
          }
        }
        dbg_msg("storage","warning no data directory found");
      }
LAB_001bd532:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_001bd557;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    str_copy(this->m_aDataDir,"data",0x200);
    return;
  }
LAB_001bd557:
  __stack_chk_fail();
}

Assistant:

void FindDataDir()
	{
		// 1) use data-dir in PWD if present
		if(fs_is_dir("data/mapres"))
		{
			str_copy(m_aDataDir, "data", sizeof(m_aDataDir));
			return;
		}

		// 2) use compiled-in data-dir if present
		if(fs_is_dir(DATA_DIR "/mapres"))
		{
			str_copy(m_aDataDir, DATA_DIR, sizeof(m_aDataDir));
			return;
		}

		// 3) check for usable path in argv[0]
		{
			char aBaseDir[IO_MAX_PATH_LENGTH];
			str_copy(aBaseDir, m_aAppDir, sizeof(aBaseDir));
			str_format(m_aDataDir, sizeof(m_aDataDir), "%s/data", aBaseDir);
			str_append(aBaseDir, "/data/mapres", sizeof(aBaseDir));

			if(fs_is_dir(aBaseDir))
				return;
			else
				m_aDataDir[0] = 0;
		}

	#if defined(CONF_FAMILY_UNIX)
		// 4) check for all default locations
		{
			const char *aDirs[] = {
				"/usr/share/teeworlds/data",
				"/usr/share/games/teeworlds/data",
				"/usr/local/share/teeworlds/data",
				"/usr/local/share/games/teeworlds/data",
				"/usr/pkg/share/teeworlds/data",
				"/usr/pkg/share/games/teeworlds/data",
				"/opt/teeworlds/data"
			};
			const int DirsCount = sizeof(aDirs) / sizeof(aDirs[0]);

			int i;
			for (i = 0; i < DirsCount; i++)
			{
				char aBuf[128];
				str_format(aBuf, sizeof(aBuf), "%s/mapres", aDirs[i]);
				if(fs_is_dir(aBuf))
				{
					str_copy(m_aDataDir, aDirs[i], sizeof(m_aDataDir));
					return;
				}
			}
		}
	#endif

		// no data-dir found
		dbg_msg("storage", "warning no data directory found");
	}